

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O2

uint64_t pac_time_until_deferred_work(tsdn_t *tsdn,pai_t *self)

{
  size_t sVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  sVar1 = ecache_npages_get((ecache_t *)(self + 1));
  uVar2 = pac_ns_until_purge(tsdn,(decay_t *)&self[0x417].expand,sVar1);
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    sVar1 = ecache_npages_get((ecache_t *)&self[0x15c].alloc_batch);
    uVar3 = pac_ns_until_purge(tsdn,(decay_t *)&self[0x437].alloc_batch,sVar1);
    if (uVar2 <= uVar3) {
      uVar3 = uVar2;
    }
  }
  return uVar3;
}

Assistant:

static uint64_t
pac_time_until_deferred_work(tsdn_t *tsdn, pai_t *self) {
	uint64_t time;
	pac_t *pac = (pac_t *)self;

	time = pac_ns_until_purge(tsdn,
	    &pac->decay_dirty,
	    ecache_npages_get(&pac->ecache_dirty));
	if (time == BACKGROUND_THREAD_DEFERRED_MIN) {
		return time;
	}

	uint64_t muzzy = pac_ns_until_purge(tsdn,
	    &pac->decay_muzzy,
	    ecache_npages_get(&pac->ecache_muzzy));
	if (muzzy < time) {
		time = muzzy;
	}
	return time;
}